

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
* __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
::operator=(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
            *this,vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
                  *other)

{
  bool bVar1;
  optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *poVar2;
  optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *poVar3;
  size_t sVar4;
  bool *pbVar5;
  long lVar6;
  size_t sVar7;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      poVar2 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = poVar2;
      sVar4 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar4;
      sVar4 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar4;
    }
    else {
      sVar4 = this->nStored;
      if (sVar4 != 0) {
        pbVar5 = &this->ptr->set;
        do {
          if (*pbVar5 == true) {
            *pbVar5 = false;
          }
          pbVar5 = pbVar5 + 0x18;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      this->nStored = 0;
      reserve(this,other->nStored);
      sVar4 = other->nStored;
      if (sVar4 != 0) {
        poVar2 = this->ptr;
        poVar3 = other->ptr;
        lVar6 = 0;
        sVar7 = sVar4;
        do {
          bVar1 = (&poVar3->set)[lVar6];
          (&poVar2->set)[lVar6] = bVar1;
          if (bVar1 == true) {
            *(undefined8 *)((long)&poVar2->optionalValue + lVar6) = 0;
            *(undefined8 *)((long)&poVar2->optionalValue + lVar6) =
                 *(undefined8 *)((long)&poVar3->optionalValue + lVar6);
            *(undefined4 *)((long)&poVar2->optionalValue + lVar6 + 8) =
                 *(undefined4 *)((long)&poVar3->optionalValue + lVar6 + 8);
            (&poVar3->set)[lVar6] = false;
          }
          lVar6 = lVar6 + 0x18;
          sVar7 = sVar7 - 1;
        } while (sVar7 != 0);
      }
      this->nStored = sVar4;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }